

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall
xatlas::internal::pack::Atlas::addCharts(Atlas *this,TaskScheduler *taskScheduler,Atlas *paramAtlas)

{
  Array<xatlas::internal::pack::Chart_*> *this_00;
  uint uVar1;
  Atlas *pAVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  uint32_t newBufferSize;
  uint32_t newCapacity;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  Task task;
  TaskGroupHandle taskGroup;
  ThreadLocal<xatlas::internal::BoundingBox2D> boundingBox;
  Array<xatlas::internal::pack::AddChartTaskArgs> taskArgs;
  TaskGroupHandle local_7c;
  TaskScheduler *local_78;
  ThreadLocal<xatlas::internal::BoundingBox2D> local_70;
  ArrayBase local_68;
  ulong local_50;
  Atlas *local_48;
  ulong local_40;
  Atlas *local_38;
  
  uVar6 = (ulong)(paramAtlas->m_chartGroups).m_base.size;
  if (uVar6 == 0) {
    uVar7 = 0;
  }
  else {
    uVar3 = 0;
    uVar7 = 0;
    do {
      lVar5 = *(long *)((paramAtlas->m_chartGroups).m_base.buffer + uVar3 * 8);
      if (*(char *)(lVar5 + 8) == '\0') {
        uVar7 = (ulong)(uint)((int)uVar7 + *(int *)(lVar5 + 0x54));
      }
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  newCapacity = (uint32_t)uVar7;
  if (newCapacity != 0) {
    local_68.buffer = (uint8_t *)0x0;
    local_68.elementSize = 0x18;
    local_68.capacity = 0;
    local_78 = taskScheduler;
    local_68.size = newCapacity;
    ArrayBase::setArrayCapacity(&local_68,newCapacity);
    local_48 = this;
    local_7c = TaskScheduler::createTaskGroup(local_78,newCapacity);
    local_50 = uVar7;
    ThreadLocal<xatlas::internal::BoundingBox2D>::ThreadLocal(&local_70);
    if (uVar6 != 0) {
      uVar7 = 0;
      uVar8 = 0;
      local_40 = uVar6;
      local_38 = paramAtlas;
      do {
        if ((paramAtlas->m_chartGroups).m_base.size <= uVar7) {
          pcVar4 = 
          "const T &xatlas::internal::Array<xatlas::internal::param::ChartGroup *>::operator[](uint32_t) const [T = xatlas::internal::param::ChartGroup *]"
          ;
LAB_001aaba6:
          __assert_fail("index < m_base.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x4a8,pcVar4);
        }
        lVar5 = *(long *)((paramAtlas->m_chartGroups).m_base.buffer + uVar7 * 8);
        if ((*(char *)(lVar5 + 8) == '\0') && (uVar1 = *(uint *)(lVar5 + 0x54), (ulong)uVar1 != 0))
        {
          lVar9 = (ulong)uVar8 * 0x18;
          uVar6 = 0;
          do {
            if ((ulong)local_68.size <= uVar8 + uVar6) goto LAB_001aab72;
            *(ThreadLocal<xatlas::internal::BoundingBox2D> **)(local_68.buffer + lVar9) = &local_70;
            if (*(uint *)(lVar5 + 0x54) <= uVar6) {
              pcVar4 = 
              "const T &xatlas::internal::Array<xatlas::internal::param::Chart *>::operator[](uint32_t) const [T = xatlas::internal::param::Chart *]"
              ;
              goto LAB_001aaba6;
            }
            *(undefined8 *)(local_68.buffer + lVar9 + 8) =
                 *(undefined8 *)(*(long *)(lVar5 + 0x48) + uVar6 * 8);
            task.userData = local_68.buffer + lVar9;
            task.func = runAddChartTask;
            TaskScheduler::run(local_78,local_7c,task);
            uVar6 = uVar6 + 1;
            lVar9 = lVar9 + 0x18;
          } while (uVar1 != uVar6);
          uVar8 = uVar8 + (int)uVar6;
          uVar6 = local_40;
          paramAtlas = local_38;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar6);
    }
    TaskScheduler::wait(local_78,&local_7c);
    pAVar2 = local_48;
    this_00 = &local_48->m_charts;
    uVar8 = (uint)local_50;
    (local_48->m_charts).m_base.size = uVar8;
    if ((local_48->m_charts).m_base.capacity < uVar8) {
      ArrayBase::setArrayCapacity(&this_00->m_base,uVar8);
    }
    uVar1 = (pAVar2->m_charts).m_base.size;
    lVar5 = 0x10;
    uVar6 = 0;
    do {
      if (local_68.size == uVar6) {
LAB_001aab72:
        pcVar4 = 
        "T &xatlas::internal::Array<xatlas::internal::pack::AddChartTaskArgs>::operator[](uint32_t) [T = xatlas::internal::pack::AddChartTaskArgs]"
        ;
LAB_001aab87:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4ae,pcVar4);
      }
      if (uVar1 == uVar6) {
        pcVar4 = 
        "T &xatlas::internal::Array<xatlas::internal::pack::Chart *>::operator[](uint32_t) [T = xatlas::internal::pack::Chart *]"
        ;
        goto LAB_001aab87;
      }
      *(undefined8 *)((this_00->m_base).buffer + uVar6 * 8) =
           *(undefined8 *)(local_68.buffer + lVar5);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar8 + (uVar8 == 0) != uVar6);
    ThreadLocal<xatlas::internal::BoundingBox2D>::~ThreadLocal(&local_70);
    ArrayBase::~ArrayBase(&local_68);
  }
  return;
}

Assistant:

void addCharts(TaskScheduler *taskScheduler, param::Atlas *paramAtlas)
	{
		// Count charts.
		uint32_t chartCount = 0;
		const uint32_t chartGroupsCount = paramAtlas->chartGroupCount();
		for (uint32_t i = 0; i < chartGroupsCount; i++) {
			const param::ChartGroup *chartGroup = paramAtlas->chartGroupAt(i);
			if (chartGroup->isVertexMap())
				continue;
			chartCount += chartGroup->chartCount();
		}
		if (chartCount == 0)
			return;
		// Run one task per chart.
		Array<AddChartTaskArgs> taskArgs;
		taskArgs.resize(chartCount);
		TaskGroupHandle taskGroup = taskScheduler->createTaskGroup(chartCount);
		uint32_t chartIndex = 0;
		ThreadLocal<BoundingBox2D> boundingBox;
		for (uint32_t i = 0; i < chartGroupsCount; i++) {
			const param::ChartGroup *chartGroup = paramAtlas->chartGroupAt(i);
			if (chartGroup->isVertexMap())
				continue;
			const uint32_t count = chartGroup->chartCount();
			for (uint32_t j = 0; j < count; j++) {
				AddChartTaskArgs &args = taskArgs[chartIndex];
				args.boundingBox = &boundingBox;
				args.paramChart = chartGroup->chartAt(j);
				Task task;
				task.userData = &taskArgs[chartIndex];
				task.func = runAddChartTask;
				taskScheduler->run(taskGroup, task);
				chartIndex++;
			}
		}
		taskScheduler->wait(&taskGroup);
		// Get task output.
		m_charts.resize(chartCount);
		for (uint32_t i = 0; i < chartCount; i++)
			m_charts[i] = taskArgs[i].chart;
	}